

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O3

string_view __thiscall
chain::str::trim_left_view<(chain::str::case_t)0>
          (str *this,string_view data,
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *to_remove)

{
  ulong *puVar1;
  ulong *puVar2;
  str *psVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  char *pcVar7;
  ulong *puVar8;
  str *psVar9;
  bool bVar10;
  string_view sVar11;
  string_view sVar12;
  
  pcVar7 = (char *)data._M_len;
  if (this == (str *)0x0) {
    this = (str *)0x0;
  }
  else {
    puVar1 = *(ulong **)data._M_str;
    puVar2 = *(ulong **)((long)data._M_str + 8);
    if (puVar1 != puVar2) {
      puVar8 = puVar1;
      bVar5 = 0;
      do {
        psVar3 = (str *)*puVar8;
        if (psVar3 <= this) {
          bVar6 = bVar5;
          do {
            bVar5 = bVar6;
            if (psVar3 != (str *)0x0) {
              psVar9 = (str *)0x0;
              do {
                if (psVar9[puVar8[1]] != *(str *)(pcVar7 + (long)psVar9)) goto LAB_001c323e;
                psVar9 = psVar9 + 1;
              } while (psVar3 != psVar9);
            }
            pcVar7 = pcVar7 + (long)psVar3;
            this = this + -(long)psVar3;
            bVar5 = 1;
            bVar6 = 1;
          } while (psVar3 <= this);
        }
LAB_001c323e:
        bVar10 = puVar8 + 2 != puVar2;
        puVar8 = puVar8 + 2;
        if (!bVar10) {
          puVar8 = puVar1;
        }
        bVar4 = (bool)(bVar10 | bVar5);
        bVar5 = bVar5 & bVar10;
        if (!bVar4) {
          sVar11._M_str = pcVar7;
          sVar11._M_len = (size_t)this;
          return sVar11;
        }
      } while( true );
    }
  }
  sVar12._M_str = pcVar7;
  sVar12._M_len = (size_t)this;
  return sVar12;
}

Assistant:

auto trim_left_view(std::string_view data, const std::vector<std::string_view>& to_remove) -> std::string_view
{
    if (!data.empty() && !to_remove.empty())
    {
        while (true)
        {
            bool had_removal{false};

            for (const auto& remove : to_remove)
            {
                while (starts_with<case_type>(data, remove))
                {
                    data.remove_prefix(remove.size());
                    had_removal = true;
                }
            }

            if (!had_removal)
            {
                break;
            }
        }
    }

    return data;
}